

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O0

string * absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,void_const*>
                   (char *v1,void *v2,char *exprtext)

{
  ostream *poVar1;
  string *psVar2;
  CheckOpMessageBuilder local_198 [8];
  CheckOpMessageBuilder comb;
  char *exprtext_local;
  void *v2_local;
  char *v1_local;
  
  v2_local = v1;
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder(local_198,exprtext)
  ;
  poVar1 = CheckOpMessageBuilder::ForVar1(local_198);
  MakeCheckOpValueString<char_const*>(poVar1,(char **)&v2_local);
  poVar1 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  absl::lts_20240722::log_internal::MakeCheckOpValueString(poVar1,v2);
  psVar2 = (string *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_()
  ;
  CheckOpMessageBuilder::~CheckOpMessageBuilder(local_198);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(T1 v1, T2 v2, const char* exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}